

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

void sha1_finalise(sha1_ctx *ctx,uint8_t *digest)

{
  uint8_t local_25;
  uint8_t local_24 [7];
  uchar c;
  uchar finalcount [8];
  uint i;
  uint8_t *digest_local;
  sha1_ctx *ctx_local;
  
  finalcount[0] = '\0';
  finalcount[1] = '\0';
  finalcount[2] = '\0';
  finalcount[3] = '\0';
  for (; (uint)finalcount._0_4_ < 8; finalcount._0_4_ = finalcount._0_4_ + 1) {
    local_24[(uint)finalcount._0_4_] =
         (uint8_t)(ctx->count[(int)(uint)((uint)finalcount._0_4_ < 4)] >>
                  (('\x03' - ((byte)finalcount._0_4_ & 3)) * '\b' & 0x1f));
  }
  local_25 = 0x80;
  unique0x100000f3 = digest;
  sha1_update(ctx,&local_25,1);
  while ((ctx->count[0] & 0x1f8) != 0x1c0) {
    local_25 = '\0';
    sha1_update(ctx,&local_25,1);
  }
  sha1_update(ctx,local_24,8);
  finalcount[0] = '\0';
  finalcount[1] = '\0';
  finalcount[2] = '\0';
  finalcount[3] = '\0';
  for (; (uint)finalcount._0_4_ < 0x14; finalcount._0_4_ = finalcount._0_4_ + 1) {
    stack0xffffffffffffffe8[(uint)finalcount._0_4_] =
         (uint8_t)(ctx->state[(uint)finalcount._0_4_ >> 2] >>
                  (('\x03' - ((byte)finalcount._0_4_ & 3)) * '\b' & 0x1f));
  }
  return;
}

Assistant:

void sha1_finalise(struct sha1_ctx *ctx, uint8_t digest[20]) {
  unsigned i;
  unsigned char finalcount[8];
  unsigned char c;

  for (i = 0; i < 8; i++) {
    finalcount[i] =
        (unsigned char)((ctx->count[(i >= 4 ? 0 : 1)] >> ((3 - (i & 3)) * 8)) &
                        255);
  }
  c = 0200;
  sha1_update(ctx, &c, 1);
  while ((ctx->count[0] & 504) != 448) {
    c = 0000;
    sha1_update(ctx, &c, 1);
  }
  sha1_update(ctx, finalcount, 8);
  for (i = 0; i < 20; i++) {
    digest[i] =
        (unsigned char)((ctx->state[i >> 2] >> ((3 - (i & 3)) * 8)) & 255);
  }
}